

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

int spec_dbon(obj *otmp,obj *olaunch,boolean thrown,monst *mon,int tmp)

{
  obj *poVar1;
  boolean bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  obj **ppoVar6;
  int iVar7;
  ushort uVar8;
  artifact *weap;
  
  if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
    weap = (artifact *)0x0;
  }
  else {
    weap = artilist + otmp->oartifact;
  }
  spec_applies_spfx_behead = 0;
  spec_dbon_applies = 0;
  spec_applies_ad_fire = '\0';
  spec_applies_ad_cold = '\0';
  spec_applies_ad_elec = '\0';
  spec_applies_ad_magm = '\0';
  spec_applies_ad_stun = '\0';
  spec_applies_ad_drli = '\0';
  if (otmp != (obj *)0x0) {
    if ((long)otmp->oartifact == 0) {
      spec_applies_spfx_behead = 0;
    }
    else {
      spec_applies_spfx_behead = (byte)((uint)artilist[otmp->oartifact].spfx >> 10) & 1;
    }
  }
  if (weap == (artifact *)0x0) {
    if (mon == &youmonst) {
      ppoVar6 = &uwep;
    }
    else {
      ppoVar6 = &mon->mw;
    }
    poVar1 = *ppoVar6;
    bVar2 = attacks(2,otmp,olaunch,thrown);
    iVar7 = 0;
    if (bVar2 == '\0') {
LAB_0014cbd8:
      bVar2 = attacks(3,otmp,olaunch,thrown);
      if (bVar2 != '\0') {
        if (mon == &youmonst) {
          if (((u.uprops[2].intrinsic == 0 && u.uprops[2].extrinsic == 0) ||
              (((u.uprops[2].intrinsic >> 0x1a & 1) != 0 &&
               ((u.uprops[2].intrinsic & 0xfbffffff) == 0 && u.uprops[2].extrinsic == 0)))) &&
             (((byte)youmonst.mintrinsics & 2) == 0)) goto LAB_0014cc47;
        }
        else {
          uVar8 = mon->mintrinsics;
LAB_0014cc00:
          if ((uVar8 & 2) == 0) {
LAB_0014cc47:
            if (((poVar1 == (obj *)0x0) || ((long)poVar1->oartifact == 0)) ||
               (artilist[poVar1->oartifact].defn.adtyp != '\x03')) {
              spec_dbon_applies = 1;
              spec_applies_ad_cold = '\x01';
              uVar4 = 6;
              if (((mon == &youmonst) && ((u.uprops[2].intrinsic >> 0x1a & 1) != 0)) &&
                 ((u.uprops[2].intrinsic & 0xfbffffff) == 0 && u.uprops[2].extrinsic == 0)) {
                bVar3 = ((byte)youmonst.mintrinsics & 2) >> 1;
                uVar4 = (uint)bVar3 + (uint)bVar3 * 2 + 3;
              }
              uVar5 = mt_random();
              iVar7 = iVar7 + uVar5 % uVar4 + 1;
            }
          }
        }
      }
    }
    else {
      if (mon == &youmonst) {
        if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) ||
            (((u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
             ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)))) &&
           (((byte)youmonst.mintrinsics & 1) == 0)) goto LAB_0014cb53;
        goto LAB_0014cbd8;
      }
      uVar8 = mon->mintrinsics;
      if ((uVar8 & 1) == 0) {
LAB_0014cb53:
        if (((poVar1 == (obj *)0x0) || ((long)poVar1->oartifact == 0)) ||
           (artilist[poVar1->oartifact].defn.adtyp != '\x02')) {
          spec_dbon_applies = 1;
          spec_applies_ad_fire = '\x01';
          uVar4 = 6;
          if (((mon == &youmonst) && ((u.uprops[1].intrinsic >> 0x1a & 1) != 0)) &&
             ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) {
            uVar4 = ((byte)youmonst.mintrinsics & 1) * 3 + 3;
          }
          uVar5 = mt_random();
          iVar7 = uVar5 % uVar4 + 1;
        }
        goto LAB_0014cbd8;
      }
      bVar2 = attacks(3,otmp,olaunch,thrown);
      iVar7 = 0;
      if (bVar2 != '\0') goto LAB_0014cc00;
    }
    bVar2 = attacks(0xf,otmp,olaunch,thrown);
    if (bVar2 != '\0') {
      if (mon == &youmonst) {
        if (u.uprops[0x35].extrinsic != 0 || u.uprops[0x35].intrinsic != 0) goto LAB_0014cd57;
        mon = &youmonst;
      }
      bVar2 = resists_drli(mon);
      if ((bVar2 == '\0') &&
         (((poVar1 == (obj *)0x0 || ((long)poVar1->oartifact == 0)) ||
          (artilist[poVar1->oartifact].defn.adtyp != '\x0f')))) {
        spec_dbon_applies = 1;
        spec_applies_ad_drli = '\x01';
      }
    }
LAB_0014cd57:
    bVar2 = oprop_attack(8,otmp,olaunch,thrown);
    if (bVar2 == '\0') {
      return iVar7;
    }
    spec_dbon_applies = 1;
    spec_applies_spfx_behead = '\x01';
    return iVar7;
  }
  if (((((weap->attk).adtyp == '\0') && ((weap->attk).damn == '\0')) && ((weap->attk).damd == '\0'))
     || (spec_dbon_applies = spec_applies(weap,mon), spec_dbon_applies == 0)) {
    return 0;
  }
  bVar3 = (weap->attk).damd;
  if (bVar3 == 0) {
    uVar4 = 1;
    if (1 < tmp) {
      uVar4 = tmp;
    }
  }
  else {
    uVar4 = mt_random();
    uVar4 = uVar4 % (uint)bVar3 + 1;
  }
  if (mon != &youmonst) {
    return uVar4;
  }
  if ((weap->spfx & 0x40) == 0) {
    return uVar4;
  }
  switch((weap->attk).adtyp) {
  case '\x02':
    if ((u.uprops[1].intrinsic >> 0x1a & 1) == 0) {
      return uVar4;
    }
    if ((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0) {
      return uVar4;
    }
    bVar3 = (byte)youmonst.mintrinsics & 1;
    break;
  case '\x03':
    if ((u.uprops[2].intrinsic >> 0x1a & 1) == 0) {
      return uVar4;
    }
    if ((u.uprops[2].intrinsic & 0xfbffffff) != 0 || u.uprops[2].extrinsic != 0) {
      return uVar4;
    }
    bVar3 = (byte)youmonst.mintrinsics & 2;
    break;
  default:
    goto switchD_0014cadc_caseD_4;
  case '\x06':
    if ((u.uprops[5].intrinsic >> 0x1a & 1) == 0) {
      return uVar4;
    }
    if ((u.uprops[5].intrinsic & 0xfbffffff) != 0 || u.uprops[5].extrinsic != 0) {
      return uVar4;
    }
    bVar3 = (byte)youmonst.mintrinsics & 0x10;
    goto joined_r0x0014ce19;
  case '\a':
    if ((u.uprops[6].intrinsic >> 0x1a & 1) == 0) {
      return uVar4;
    }
    if ((u.uprops[6].intrinsic & 0xfbffffff) != 0 || u.uprops[6].extrinsic != 0) {
      return uVar4;
    }
    bVar3 = (byte)youmonst.mintrinsics & 0x20;
joined_r0x0014ce19:
    if (bVar3 != 0) {
      return uVar4;
    }
    goto LAB_0014ce1f;
  }
  if (bVar3 == 0) {
LAB_0014ce1f:
    uVar4 = uVar4 + 1 >> 1;
  }
switchD_0014cadc_caseD_4:
  return uVar4;
}

Assistant:

int spec_dbon(struct obj *otmp, struct obj *olaunch, boolean thrown,
	      struct monst *mon, int tmp)
{
	const struct artifact *weap = get_artifact(otmp);
	boolean yours = (mon == &youmonst);

	spec_dbon_applies = FALSE;

	spec_applies_ad_fire = FALSE;
	spec_applies_ad_cold = FALSE;
	spec_applies_ad_elec = FALSE;
	spec_applies_ad_magm = FALSE;
	spec_applies_ad_stun = FALSE;
	spec_applies_ad_drli = FALSE;
	spec_applies_spfx_behead = spec_ability(otmp, SPFX_BEHEAD);

	if (!weap) {
	    /* Object must have properties, which might stack. */
	    int propdmg = 0;
	    struct obj *defwep = (yours ? uwep : MON_WEP(mon));

	    if ((attacks(AD_FIRE, otmp, olaunch, thrown) &&
		!(yours ? FFire_resistance : resists_fire(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_FIRE, defwep)))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_fire = TRUE;
		propdmg += rnd((yours && PFire_resistance) ? 3 : 6);
	    }

	    if ((attacks(AD_COLD, otmp, olaunch, thrown) &&
		!(yours ? FCold_resistance : resists_cold(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_COLD, defwep)))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_cold = TRUE;
		propdmg += rnd((yours && PCold_resistance) ? 3 : 6);
	    }

	    /* No AD_MAGM/spec_applies_ad_magm (magic missile) property effect. */

	    /* No AD_STUN/spec_applies_ad_stun (stun) property effect. */

	    /* Life-draining is handled specially in artifact_hit(). */
	    if (attacks(AD_DRLI, otmp, olaunch, thrown) &&
		!(yours ? Drain_resistance : resists_drli(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_DRLI, defwep))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_drli = TRUE;
	    }

	    /* [SPFX_BEHEAD] This *may* apply; only artifact_hit_behead()
	     * truly decides that. */
	    if (oprop_attack(ITEM_VORPAL, otmp, olaunch, thrown)) {
		spec_dbon_applies = TRUE;
		spec_applies_spfx_behead = TRUE;
	    }

	    return propdmg;
	}

	if (!weap || (weap->attk.adtyp == AD_PHYS && /* check for `NO_ATTK' */
			weap->attk.damn == 0 && weap->attk.damd == 0))
	    spec_dbon_applies = FALSE;
	else
	    spec_dbon_applies = spec_applies(weap, mon);

	if (spec_dbon_applies) {
	    int dmg_bonus = weap->attk.damd ? rnd(weap->attk.damd) : max(tmp, 1);
	    /* halve artifact bonus damage for partial resistances */
	    if (yours && (weap->spfx & SPFX_ATTK)) {
		uchar adtyp = weap->attk.adtyp;
		if ((adtyp == AD_FIRE && PFire_resistance) ||
		    (adtyp == AD_COLD && PCold_resistance) ||
		    (adtyp == AD_ELEC && PShock_resistance) ||
		    (adtyp == AD_DRST && PPoison_resistance)) {
		    dmg_bonus = (dmg_bonus + 1) / 2;
		}
	    }
	    return dmg_bonus;
	}
	return 0;
}